

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O1

uint Kit_GraphToTruth(Kit_Graph_t *pGraph)

{
  Kit_Edge_t KVar1;
  Kit_Node_t *pKVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  uVar3 = pGraph->nLeaves;
  if ((int)uVar3 < 0) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitGraph.c"
                  ,0x13a,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  if (pGraph->nSize < (int)uVar3) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) <= pGraph->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitGraph.c"
                  ,0x13b,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  if (5 < (int)uVar3) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitGraph.c"
                  ,0x13c,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  KVar1 = pGraph->eRoot;
  if (pGraph->fConst == 0) {
    uVar6 = (uint)KVar1 >> 1 & 0x3fffffff;
    if (uVar6 < uVar3) {
      if (((uint)KVar1 & 1) == 0) {
        if (uVar3 <= uVar6) {
LAB_005cf4f7:
          __assert_fail("Kit_GraphIsVar( pGraph )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                        ,0xdb,"int Kit_GraphVarInt(Kit_Graph_t *)");
        }
        uVar3 = (&DAT_009f4ab0)[uVar6];
      }
      else {
        if (uVar3 <= uVar6) goto LAB_005cf4f7;
        uVar3 = ~(&DAT_009f4ab0)[uVar6];
      }
    }
    else {
      iVar7 = pGraph->nLeaves;
      if (0 < iVar7) {
        puVar4 = &DAT_009f4ab0;
        lVar5 = 2;
        lVar8 = 0;
        do {
          *(ulong *)(&pGraph->pNodes->eEdge0 + lVar5) = (ulong)*puVar4;
          lVar8 = lVar8 + 1;
          iVar7 = pGraph->nLeaves;
          puVar4 = puVar4 + 1;
          lVar5 = lVar5 + 6;
        } while (lVar8 < iVar7);
      }
      uVar3 = 0;
      if (iVar7 < pGraph->nSize) {
        lVar8 = (long)iVar7;
        lVar5 = lVar8 * 0x18 + 8;
        do {
          pKVar2 = pGraph->pNodes;
          uVar3 = *(uint *)((long)pKVar2 + lVar5 + -8);
          uVar6 = *(uint *)((long)pKVar2 + lVar5 + -4);
          uVar3 = (-(uVar6 & 1) ^ pKVar2[uVar6 >> 1 & 0x3fffffff].field_2.iFunc) &
                  (-(uVar3 & 1) ^ pKVar2[uVar3 >> 1 & 0x3fffffff].field_2.iFunc);
          *(ulong *)(&(pKVar2->eEdge0).field_0x0 + lVar5) = (ulong)uVar3;
          lVar8 = lVar8 + 1;
          lVar5 = lVar5 + 0x18;
        } while (lVar8 < pGraph->nSize);
      }
      uVar3 = -((uint)pGraph->eRoot & 1) ^ uVar3;
    }
  }
  else {
    uVar3 = ((uint)KVar1 & 1) - 1;
  }
  return uVar3;
}

Assistant:

unsigned Kit_GraphToTruth( Kit_Graph_t * pGraph )
{
    unsigned uTruths[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth = 0, uTruth0, uTruth1;
    Kit_Node_t * pNode;
    int i;

    // sanity checks
    assert( Kit_GraphLeaveNum(pGraph) >= 0 );
    assert( Kit_GraphLeaveNum(pGraph) <= pGraph->nSize );
    assert( Kit_GraphLeaveNum(pGraph) <= 5 );

    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Kit_GraphIsComplement(pGraph)? 0 : ~((unsigned)0);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Kit_GraphIsComplement(pGraph)? ~uTruths[Kit_GraphVarInt(pGraph)] : uTruths[Kit_GraphVarInt(pGraph)];

    // assign the elementary variables
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = (void *)(long)uTruths[i];

    // compute the function for each internal node
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        uTruth0 = (unsigned)(long)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc;
        uTruth1 = (unsigned)(long)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc;
        uTruth0 = pNode->eEdge0.fCompl? ~uTruth0 : uTruth0;
        uTruth1 = pNode->eEdge1.fCompl? ~uTruth1 : uTruth1;
        uTruth = uTruth0 & uTruth1;
        pNode->pFunc = (void *)(long)uTruth;
    }

    // complement the result if necessary
    return Kit_GraphIsComplement(pGraph)? ~uTruth : uTruth;
}